

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O0

void __thiscall cppassert::internal::StackTraceImpl::collect(StackTraceImpl *this)

{
  void *address;
  int iVar1;
  char **ppcVar2;
  char *symbol;
  StackFrame local_68;
  BackTraceSymbol local_58;
  BackTraceSymbol local_48;
  ulong local_38;
  size_t i;
  undefined1 local_20 [8];
  CppDemangler demangler;
  StackTraceImpl *this_local;
  
  demangler.funcName_ = (char *)this;
  freeSymbols(this);
  CppDemangler::CppDemangler((CppDemangler *)local_20);
  iVar1 = backtrace(this->backtrace_,0x100);
  this->backtraceSize_ = (long)iVar1;
  ppcVar2 = (char **)backtrace_symbols(this->backtrace_,this->backtraceSize_ & 0xffffffff);
  this->symbols_ = ppcVar2;
  for (local_38 = 2; local_38 < this->backtraceSize_; local_38 = local_38 + 1) {
    if (this->symbols_ == (char **)0x0) {
      BackTraceSymbol::BackTraceSymbol(&local_58);
      BackTraceSymbol::operator=(this->demangledSymbols_ + local_38,&local_58);
      BackTraceSymbol::~BackTraceSymbol(&local_58);
    }
    else {
      BackTraceSymbol::createFromBacktraceStr
                (&local_48,this->symbols_[local_38],(CppDemangler *)local_20);
      BackTraceSymbol::operator=(this->demangledSymbols_ + local_38,&local_48);
      BackTraceSymbol::~BackTraceSymbol(&local_48);
    }
    address = this->backtrace_[local_38];
    symbol = BackTraceSymbol::symbol(this->demangledSymbols_ + local_38);
    StackTrace::StackFrame::StackFrame(&local_68,address,symbol);
    this->frames_[local_38 - 2].address_ = local_68.address_;
    this->frames_[local_38 - 2].symbol_ = local_68.symbol_;
  }
  CppDemangler::~CppDemangler((CppDemangler *)local_20);
  return;
}

Assistant:

void collect()
    {
        freeSymbols();
        CppDemangler demangler;
        backtraceSize_ = ::backtrace(backtrace_, BufferSize);
        symbols_ = ::backtrace_symbols(backtrace_, backtraceSize_);

        for(std::size_t i=cFramesToSkip; i<backtraceSize_; ++i)
        {
            if(symbols_)
            {
                demangledSymbols_[i]
                    = BackTraceSymbol::createFromBacktraceStr(symbols_[i]
                                                            , &demangler);
            }
            else
            {
                demangledSymbols_[i] = BackTraceSymbol();
            }

            frames_[i-cFramesToSkip] = StackTrace::StackFrame(backtrace_[i]
                                            , demangledSymbols_[i].symbol());
        }
    }